

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O2

void __thiscall
google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::EndList(AnyWriter *this)

{
  int iVar1;
  ProtoStreamObjectWriter *pPVar2;
  LogMessage *other;
  Event local_90;
  LogFinisher local_19;
  
  iVar1 = this->depth_;
  this->depth_ = iVar1 + -1;
  if (iVar1 < 1) {
    protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/util/internal/protostream_objectwriter.cc"
               ,0x119);
    other = protobuf::internal::LogMessage::operator<<
                      ((LogMessage *)&local_90,"Mismatched EndList found, should not be possible");
    protobuf::internal::LogFinisher::operator=(&local_19,other);
    protobuf::internal::LogMessage::~LogMessage((LogMessage *)&local_90);
    this->depth_ = 0;
  }
  pPVar2 = (this->ow_)._M_t.
           super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
           .
           super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_false>
           ._M_head_impl;
  if (pPVar2 == (ProtoStreamObjectWriter *)0x0) {
    local_90.name_._M_dataplus._M_p = (pointer)&local_90.name_.field_2;
    local_90.type_ = END_LIST;
    local_90.name_._M_string_length = 0;
    local_90.name_.field_2._M_local_buf[0] = '\0';
    local_90.value_._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003e3c20;
    local_90.value_.type_ = TYPE_NULL;
    local_90.value_.field_2.i32_ = 0;
    local_90.value_.use_strict_base64_decoding_ = false;
    local_90.value_storage_._M_dataplus._M_p = (pointer)&local_90.value_storage_.field_2;
    local_90.value_storage_._M_string_length = 0;
    local_90.value_storage_.field_2._M_local_buf[0] = '\0';
    std::
    vector<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event,_std::allocator<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event>_>
    ::emplace_back<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event>
              (&this->uninterpreted_events_,&local_90);
    Event::~Event(&local_90);
  }
  else {
    (**(code **)(*(long *)&(pPVar2->super_ProtoWriter).super_StructuredObjectWriter + 0x28))();
  }
  return;
}

Assistant:

void ProtoStreamObjectWriter::AnyWriter::EndList() {
  --depth_;
  if (depth_ < 0) {
    GOOGLE_LOG(DFATAL) << "Mismatched EndList found, should not be possible";
    depth_ = 0;
  }
  if (ow_ == nullptr) {
    // Save data before the "@type" field for later replay.
    uninterpreted_events_.push_back(Event(Event::END_LIST));
  } else {
    ow_->EndList();
  }
}